

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O2

void __thiscall xLearn::DMatrix::Serialize(DMatrix *this,string *filename)

{
  FILE *file;
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  allocator local_76;
  allocator local_75;
  Logger local_74;
  string local_70;
  string local_50;
  
  if (filename->_M_string_length == 0) {
    local_74.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
               ,&local_75);
    std::__cxx11::string::string((string *)&local_70,"Serialize",&local_76);
    poVar1 = Logger::Start(ERR,&local_50,0x14e,&local_70);
    poVar1 = std::operator<<(poVar1,"CHECK_NE failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x14e);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"filename.empty()");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"true");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::operator<<(poVar1,"\n");
  }
  else {
    uVar2 = (ulong)this->row_length;
    if ((long)(this->row).
              super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->row).
              super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar2) {
      if ((long)(this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == uVar2) {
        if ((long)(this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 == uVar2) {
          file = OpenFileOrDie((filename->_M_dataplus)._M_p,"w");
          WriteDataToDisk(file,(char *)this,8);
          WriteDataToDisk(file,(char *)&this->hash_value_2,8);
          WriteDataToDisk(file,(char *)&this->row_length,4);
          for (uVar2 = 0; uVar2 < this->row_length; uVar2 = uVar2 + 1) {
            WriteVectorToFile<xLearn::Node>
                      (file,(this->row).
                            super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar2]);
          }
          WriteVectorToFile<float>(file,&this->Y);
          WriteVectorToFile<float>(file,&this->norm);
          WriteDataToDisk(file,&this->has_label,1);
          WriteDataToDisk(file,(char *)&this->pos,4);
          Close(file);
          return;
        }
        local_74.severity_ = ERR;
        std::__cxx11::string::string
                  ((string *)&local_50,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
                   ,&local_75);
        std::__cxx11::string::string((string *)&local_70,"Serialize",&local_76);
        poVar1 = Logger::Start(ERR,&local_50,0x151,&local_70);
        poVar1 = std::operator<<(poVar1,"CHECK_EQ failed ");
        poVar1 = std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
                                );
        poVar1 = std::operator<<(poVar1,":");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x151);
        poVar1 = std::operator<<(poVar1,"\n");
        poVar1 = std::operator<<(poVar1,"row_length");
        poVar1 = std::operator<<(poVar1," = ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1,"\n");
        poVar1 = std::operator<<(poVar1,"norm.size()");
        poVar1 = std::operator<<(poVar1," = ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(poVar1,"\n");
      }
      else {
        local_74.severity_ = ERR;
        std::__cxx11::string::string
                  ((string *)&local_50,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
                   ,&local_75);
        std::__cxx11::string::string((string *)&local_70,"Serialize",&local_76);
        poVar1 = Logger::Start(ERR,&local_50,0x150,&local_70);
        poVar1 = std::operator<<(poVar1,"CHECK_EQ failed ");
        poVar1 = std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
                                );
        poVar1 = std::operator<<(poVar1,":");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x150);
        poVar1 = std::operator<<(poVar1,"\n");
        poVar1 = std::operator<<(poVar1,"row_length");
        poVar1 = std::operator<<(poVar1," = ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1,"\n");
        poVar1 = std::operator<<(poVar1,"Y.size()");
        poVar1 = std::operator<<(poVar1," = ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(poVar1,"\n");
      }
    }
    else {
      local_74.severity_ = ERR;
      std::__cxx11::string::string
                ((string *)&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
                 ,&local_75);
      std::__cxx11::string::string((string *)&local_70,"Serialize",&local_76);
      poVar1 = Logger::Start(ERR,&local_50,0x14f,&local_70);
      poVar1 = std::operator<<(poVar1,"CHECK_EQ failed ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x14f);
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"row_length");
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"row.size()");
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,"\n");
    }
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  Logger::~Logger(&local_74);
  abort();
}

Assistant:

void Serialize(const std::string& filename) {
    CHECK_NE(filename.empty(), true);
    CHECK_EQ(row_length, row.size());
    CHECK_EQ(row_length, Y.size());
    CHECK_EQ(row_length, norm.size());
#ifndef _MSC_VER
    FILE* file = OpenFileOrDie(filename.c_str(), "w");
#else
    FILE* file = OpenFileOrDie(filename.c_str(), "wb");
#endif
    // Write hash_value
    WriteDataToDisk(file, (char*)&hash_value_1, sizeof(hash_value_1));
    WriteDataToDisk(file, (char*)&hash_value_2, sizeof(hash_value_2));
    // Write row_length
    WriteDataToDisk(file, (char*)&row_length, sizeof(row_length));
    // Write row
    for (size_t i = 0; i < row_length; ++i) {
      WriteVectorToFile(file, *(row[i]));
    }
    // Write Y
    WriteVectorToFile(file, Y);
    // Write norm
    WriteVectorToFile(file, norm);
    // Write has_label
    WriteDataToDisk(file, (char*)&has_label, sizeof(has_label));
    // Write pos
    WriteDataToDisk(file, (char*)&pos, sizeof(pos));
    Close(file);
  }